

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

void __thiscall Assimp::Blender::Object::Object(Object *this)

{
  (this->super_ElemBase).dna_type = (char *)0x0;
  (this->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Object_0075cf70;
  (this->id).super_ElemBase.dna_type = (char *)0x0;
  (this->id).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_0075cde8;
  this->type = Type_EMPTY;
  (this->modifiers).super_ElemBase.dna_type = (char *)0x0;
  this->parent = (Object *)0x0;
  (this->track).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->track).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->proxy).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->proxy).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->proxy_from).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->proxy_from).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->proxy_group).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->proxy_group).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->dup_group).super___shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->dup_group).super___shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->data).super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->data).super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->modifiers).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ListBase_0075ce20;
  (this->modifiers).first.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->modifiers).first.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->modifiers).last.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->modifiers).last.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

ElemBase()
    : dna_type(nullptr)
    {
        // empty
    }